

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptHash::ScriptHash(ScriptHash *this,string *script_hash)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  string *local_18;
  string *script_hash_local;
  ScriptHash *this_local;
  
  this->_vptr_ScriptHash = (_func_int **)&PTR__ScriptHash_0088cb08;
  local_18 = script_hash;
  script_hash_local = (string *)this;
  StringUtil::StringToByte(&local_30,(string *)script_hash);
  ByteData::ByteData(&this->script_hash_,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return;
}

Assistant:

ScriptHash::ScriptHash(const std::string& script_hash)
    : script_hash_(StringUtil::StringToByte(script_hash)) {
  // do nothing
}